

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O1

void load_GL_INTEL_performance_query(GLADloadproc load)

{
  if (GLAD_GL_INTEL_performance_query != 0) {
    glad_glBeginPerfQueryINTEL = (PFNGLBEGINPERFQUERYINTELPROC)(*load)("glBeginPerfQueryINTEL");
    glad_glCreatePerfQueryINTEL = (PFNGLCREATEPERFQUERYINTELPROC)(*load)("glCreatePerfQueryINTEL");
    glad_glDeletePerfQueryINTEL = (PFNGLDELETEPERFQUERYINTELPROC)(*load)("glDeletePerfQueryINTEL");
    glad_glEndPerfQueryINTEL = (PFNGLENDPERFQUERYINTELPROC)(*load)("glEndPerfQueryINTEL");
    glad_glGetFirstPerfQueryIdINTEL =
         (PFNGLGETFIRSTPERFQUERYIDINTELPROC)(*load)("glGetFirstPerfQueryIdINTEL");
    glad_glGetNextPerfQueryIdINTEL =
         (PFNGLGETNEXTPERFQUERYIDINTELPROC)(*load)("glGetNextPerfQueryIdINTEL");
    glad_glGetPerfCounterInfoINTEL =
         (PFNGLGETPERFCOUNTERINFOINTELPROC)(*load)("glGetPerfCounterInfoINTEL");
    glad_glGetPerfQueryDataINTEL =
         (PFNGLGETPERFQUERYDATAINTELPROC)(*load)("glGetPerfQueryDataINTEL");
    glad_glGetPerfQueryIdByNameINTEL =
         (PFNGLGETPERFQUERYIDBYNAMEINTELPROC)(*load)("glGetPerfQueryIdByNameINTEL");
    glad_glGetPerfQueryInfoINTEL =
         (PFNGLGETPERFQUERYINFOINTELPROC)(*load)("glGetPerfQueryInfoINTEL");
  }
  return;
}

Assistant:

static void load_GL_INTEL_performance_query(GLADloadproc load) {
	if(!GLAD_GL_INTEL_performance_query) return;
	glad_glBeginPerfQueryINTEL = (PFNGLBEGINPERFQUERYINTELPROC)load("glBeginPerfQueryINTEL");
	glad_glCreatePerfQueryINTEL = (PFNGLCREATEPERFQUERYINTELPROC)load("glCreatePerfQueryINTEL");
	glad_glDeletePerfQueryINTEL = (PFNGLDELETEPERFQUERYINTELPROC)load("glDeletePerfQueryINTEL");
	glad_glEndPerfQueryINTEL = (PFNGLENDPERFQUERYINTELPROC)load("glEndPerfQueryINTEL");
	glad_glGetFirstPerfQueryIdINTEL = (PFNGLGETFIRSTPERFQUERYIDINTELPROC)load("glGetFirstPerfQueryIdINTEL");
	glad_glGetNextPerfQueryIdINTEL = (PFNGLGETNEXTPERFQUERYIDINTELPROC)load("glGetNextPerfQueryIdINTEL");
	glad_glGetPerfCounterInfoINTEL = (PFNGLGETPERFCOUNTERINFOINTELPROC)load("glGetPerfCounterInfoINTEL");
	glad_glGetPerfQueryDataINTEL = (PFNGLGETPERFQUERYDATAINTELPROC)load("glGetPerfQueryDataINTEL");
	glad_glGetPerfQueryIdByNameINTEL = (PFNGLGETPERFQUERYIDBYNAMEINTELPROC)load("glGetPerfQueryIdByNameINTEL");
	glad_glGetPerfQueryInfoINTEL = (PFNGLGETPERFQUERYINFOINTELPROC)load("glGetPerfQueryInfoINTEL");
}